

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

_Bool xpk_decode_tiled(XPK *xpk)

{
  _Bool _Var1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  FILE *__s;
  LPStatus status;
  LPStatus local_14;
  
  local_14 = (LPStatus)((ulong)in_RAX >> 0x20);
  _Var1 = XPK_TiledModeOK(xpk);
  if (_Var1) {
    rgba = XPK_DecodeTiledMode(xpk,&local_14);
    if (local_14 == LUNAPURPURA_OK) {
      if (want_png == '\0') {
        __s = fopen(out_path,"wb");
        fwrite(rgba,4,0x4b000,__s);
        fclose(__s);
        if (want_png != '\x01') {
          return true;
        }
      }
      iVar2 = stbi_write_png(out_path,0x280,0x1e0,4,rgba,0xa00);
      _Var1 = true;
      if (iVar2 == 0) {
        _Var1 = false;
        LPWarn("xpk","stbi_write_png() failed: %d",0);
      }
    }
    else {
      pcVar3 = LPStatusString(local_14);
      _Var1 = false;
      LPWarn("xpk","couldn\'t decode in tiled mode: %s",pcVar3);
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool
xpk_decode_tiled(const XPK *xpk)
{
	if (!XPK_TiledModeOK(xpk)) {
		return false;
	}

	LPStatus status;
	rgba = XPK_DecodeTiledMode(xpk, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_XPK, "couldn't decode in tiled mode: %s", LPStatusString(status));
		return false;
	}

#ifdef LUNAPURPURA_PNG_SUPPORT
	if (!want_png)
#else
	if (true)
#endif
	{
		FILE *out_f = fopen(out_path, "wb"); /* XXX make sure this is ok */
		fwrite(rgba, 4, 640*480, out_f);
		fclose(out_f);
	}

#ifdef LUNAPURPURA_PNG_SUPPORT
	if (want_png) {
		int rv = stbi_write_png(out_path, 640, 480, 4, rgba, 640*4);
		if (!rv) {
			LPWarn(LP_SUBSYSTEM_XPK, "stbi_write_png() failed: %d", rv);
			return false;
		}
	}
#endif

	return true;
}